

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

void __thiscall
Clasp::SharedContext::simplify(SharedContext *this,size_type trailStart,bool shuffle)

{
  Constraint *pCVar1;
  bool bVar2;
  size_type sVar3;
  uint32 uVar4;
  uint32 uVar5;
  size_type sVar6;
  uint uVar7;
  size_type sVar8;
  size_type sVar9;
  Solver *pSVar10;
  LitVec *this_00;
  const_reference pLVar11;
  ConstraintDB *this_01;
  reference ppCVar12;
  reference ppSVar13;
  iterator ppCVar14;
  difference_type dVar15;
  iterator ppCVar16;
  Constraint **first;
  byte in_DL;
  uint in_ESI;
  SharedContext *in_RDI;
  Solver *unaff_retaddr;
  ShortImplicationsGraph *in_stack_00000008;
  Literal in_stack_00000014;
  Solver *x;
  size_type s;
  Constraint *c;
  size_type end;
  size_type i;
  uint32 rem;
  ConstraintDB *db;
  Literal p;
  LitVec *trail;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined8 in_stack_ffffffffffffff50;
  undefined1 shuffle_00;
  ConstraintDB *last;
  pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *in_stack_ffffffffffffff58;
  Solver *in_stack_ffffffffffffff60;
  size_type local_44;
  size_type local_30;
  int local_2c;
  Literal local_1c;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *local_18;
  byte local_d;
  uint local_c;
  
  local_d = in_DL & 1;
  local_c = in_ESI;
  bVar2 = isShared((SharedContext *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  uVar7 = local_c;
  shuffle_00 = (undefined1)((ulong)in_stack_ffffffffffffff50 >> 0x38);
  if (!bVar2) {
    pSVar10 = master((SharedContext *)0x1d69a0);
    this_00 = Solver::trail(pSVar10);
    sVar3 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(this_00);
    shuffle_00 = (undefined1)((ulong)in_stack_ffffffffffffff50 >> 0x38);
    if (uVar7 < sVar3) {
      pSVar10 = master((SharedContext *)0x1d69c8);
      local_18 = Solver::trail(pSVar10);
      while( true ) {
        uVar7 = local_c;
        sVar3 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(local_18);
        shuffle_00 = (undefined1)((ulong)in_stack_ffffffffffffff50 >> 0x38);
        if (uVar7 == sVar3) break;
        pLVar11 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                            (local_18,local_c);
        local_1c.rep_ = pLVar11->rep_;
        uVar4 = Literal::id(&local_1c);
        uVar5 = ShortImplicationsGraph::size((ShortImplicationsGraph *)0x1d6a3d);
        if (uVar4 < uVar5) {
          master((SharedContext *)0x1d6a5f);
          ShortImplicationsGraph::removeTrue(in_stack_00000008,unaff_retaddr,in_stack_00000014);
        }
        local_c = local_c + 1;
      }
    }
  }
  pSVar10 = master((SharedContext *)0x1d6aa5);
  this_01 = &pSVar10->constraints_;
  uVar4 = concurrency(in_RDI);
  if ((uVar4 == 1) || (pSVar10 = master((SharedContext *)0x1d6acc), pSVar10->dbIdx_ == 0)) {
    master((SharedContext *)0x1d6adf);
    simplifyDB<bk_lib::pod_vector<Clasp::Constraint*,std::allocator<Clasp::Constraint*>>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(bool)shuffle_00);
  }
  else {
    local_2c = 0;
    local_30 = 0;
    sVar6 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::size
                      (this_01);
    for (; local_30 != sVar6; local_30 = local_30 + 1) {
      ppCVar12 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::
                 operator[](this_01,local_30);
      pCVar1 = *ppCVar12;
      pSVar10 = master((SharedContext *)0x1d6b74);
      uVar7 = (*pCVar1->_vptr_Constraint[4])(pCVar1,pSVar10,(ulong)local_d & 1);
      if ((uVar7 & 1) != 0) {
        pSVar10 = master((SharedContext *)0x1d6bac);
        (*pCVar1->_vptr_Constraint[5])(pCVar1,pSVar10,0);
        ppCVar12 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::
                   operator[](this_01,local_30);
        *ppCVar12 = (Constraint *)0x0;
        local_2c = local_2c + 1;
      }
    }
    if (local_2c != 0) {
      for (local_44 = 1;
          sVar8 = bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::size
                            (&in_RDI->solvers_), local_44 != sVar8; local_44 = local_44 + 1) {
        ppSVar13 = bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::operator[]
                             (&in_RDI->solvers_,local_44);
        pSVar10 = *ppSVar13;
        uVar7 = pSVar10->dbIdx_;
        sVar6 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::size
                          (this_01);
        if (sVar6 < uVar7) {
          Potassco::fail(-1,"void Clasp::SharedContext::simplify(LitVec::size_type, bool)",0x47a,
                         "x.dbIdx_ <= db.size()","Invalid DB idx!",0);
        }
        sVar6 = pSVar10->dbIdx_;
        sVar9 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::size
                          (this_01);
        if (sVar6 == sVar9) {
          pSVar10->dbIdx_ = pSVar10->dbIdx_ - local_2c;
        }
        else if (pSVar10->dbIdx_ != 0) {
          in_stack_ffffffffffffff60 =
               (Solver *)
               bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::begin
                         (this_01);
          ppCVar14 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::
                     begin(this_01);
          dVar15 = std::count_if<Clasp::Constraint**,Clasp::IsNull>
                             (in_stack_ffffffffffffff60,ppCVar14 + pSVar10->dbIdx_);
          pSVar10->dbIdx_ = pSVar10->dbIdx_ - (int)dVar15;
        }
      }
      last = this_01;
      ppCVar14 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::
                 begin(this_01);
      ppCVar16 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::end
                           (this_01);
      first = std::remove_if<Clasp::Constraint**,Clasp::IsNull>(ppCVar14,ppCVar16);
      bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::end(this_01);
      bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::erase
                ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                 in_stack_ffffffffffffff60,first,(iterator)last);
    }
  }
  uVar4 = sizeVec<bk_lib::pod_vector<Clasp::Constraint*,std::allocator<Clasp::Constraint*>>>
                    ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                     0x1d6ddb);
  pSVar10 = master((SharedContext *)0x1d6de9);
  pSVar10->dbIdx_ = uVar4;
  return;
}

Assistant:

void SharedContext::simplify(LitVec::size_type trailStart, bool shuffle) {
	if (!isShared() && trailStart < master()->trail().size()) {
		for (const LitVec& trail = master()->trail(); trailStart != trail.size(); ++trailStart) {
			Literal p = trail[trailStart];
			if (p.id() < btig_.size()) { btig_.removeTrue(*master(), p); }
		}
	}
	Solver::ConstraintDB& db = master()->constraints_;
	if (concurrency() == 1 || master()->dbIdx_ == 0) {
		Clasp::simplifyDB(*master(), db, shuffle);
	}
	else {
		uint32 rem = 0;
		for (Solver::ConstraintDB::size_type i = 0, end = db.size(); i != end; ++i) {
			Constraint* c = db[i];
			if (c->simplify(*master(), shuffle)) { c->destroy(master(), false); db[i] = 0; ++rem; }
		}
		if (rem) {
			for (SolverVec::size_type s = 1; s != solvers_.size(); ++s) {
				Solver& x = *solvers_[s];
				POTASSCO_ASSERT(x.dbIdx_ <= db.size(), "Invalid DB idx!");
				if      (x.dbIdx_ == db.size()) { x.dbIdx_ -= rem; }
				else if (x.dbIdx_ != 0)         { x.dbIdx_ -= (uint32)std::count_if(db.begin(), db.begin()+x.dbIdx_, IsNull()); }
			}
			db.erase(std::remove_if(db.begin(), db.end(), IsNull()), db.end());
		}
	}
	master()->dbIdx_ = sizeVec(db);
}